

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageIO.cpp
# Opt level: O2

void Imf_3_2::loadFlatTiledImage(string *fileName,Header *hdr,FlatImage *img)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  LevelMode LVar4;
  int iVar5;
  int iVar6;
  _Rb_tree_node_base *p_Var7;
  _Rb_tree_node_base *p_Var8;
  undefined8 uVar9;
  long lVar10;
  int y;
  int x;
  TiledInputFile in;
  allocator<char> local_61;
  TiledInputFile local_60 [16];
  string local_50;
  
  pcVar2 = (fileName->_M_dataplus)._M_p;
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledInputFile::TiledInputFile(local_60,pcVar2,iVar3);
  Imf_3_2::TiledInputFile::header();
  Imf_3_2::Header::channels();
  Image::clearChannels(&img->super_Image);
  p_Var7 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
  while( true ) {
    p_Var8 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    if (p_Var7 == p_Var8) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,(char *)(p_Var7 + 1),&local_61);
    Image::insertChannel(&img->super_Image,&local_50,(Channel *)(p_Var7 + 9));
    std::__cxx11::string::~string((string *)&local_50);
    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
  }
  Imf_3_2::TiledInputFile::header();
  uVar9 = Imf_3_2::Header::dataWindow();
  Imf_3_2::TiledInputFile::header();
  lVar10 = Imf_3_2::Header::tileDescription();
  uVar1 = *(uint *)(lVar10 + 8);
  Imf_3_2::TiledInputFile::header();
  Imf_3_2::Header::tileDescription();
  (*(img->super_Image)._vptr_Image[2])(img,uVar9,(ulong)uVar1);
  LVar4 = Image::levelMode(&img->super_Image);
  if (LVar4 == ONE_LEVEL) {
    anon_unknown_21::loadLevel(local_60,img,0,0);
  }
  else if (LVar4 == MIPMAP_LEVELS) {
    iVar3 = 0;
    while( true ) {
      iVar5 = Image::numLevels(&img->super_Image);
      if (iVar5 <= iVar3) break;
      anon_unknown_21::loadLevel(local_60,img,iVar3,iVar3);
      iVar3 = iVar3 + 1;
    }
  }
  else if (LVar4 == RIPMAP_LEVELS) {
    iVar3 = 0;
    while( true ) {
      iVar5 = Image::numYLevels(&img->super_Image);
      if (iVar5 <= iVar3) break;
      iVar5 = 0;
      while( true ) {
        iVar6 = Image::numXLevels(&img->super_Image);
        if (iVar6 <= iVar5) break;
        anon_unknown_21::loadLevel(local_60,img,iVar5,iVar3);
        iVar5 = iVar5 + 1;
      }
      iVar3 = iVar3 + 1;
    }
  }
  Imf_3_2::TiledInputFile::header();
  p_Var7 = (_Rb_tree_node_base *)Imf_3_2::Header::begin();
  while( true ) {
    Imf_3_2::TiledInputFile::header();
    p_Var8 = (_Rb_tree_node_base *)Imf_3_2::Header::end();
    if (p_Var7 == p_Var8) break;
    Imf_3_2::Header::insert((char *)hdr,(Attribute *)(p_Var7 + 1));
    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
  }
  Imf_3_2::TiledInputFile::~TiledInputFile(local_60);
  return;
}

Assistant:

void
loadFlatTiledImage (const string& fileName, Header& hdr, FlatImage& img)
{
    TiledInputFile in (fileName.c_str ());

    const ChannelList& cl = in.header ().channels ();

    img.clearChannels ();

    for (ChannelList::ConstIterator i = cl.begin (); i != cl.end (); ++i)
        img.insertChannel (i.name (), i.channel ());

    img.resize (
        in.header ().dataWindow (),
        in.header ().tileDescription ().mode,
        in.header ().tileDescription ().roundingMode);

    switch (img.levelMode ())
    {
        case ONE_LEVEL: loadLevel (in, img, 0, 0); break;

        case MIPMAP_LEVELS:

            for (int x = 0; x < img.numLevels (); ++x)
                loadLevel (in, img, x, x);

            break;

        case RIPMAP_LEVELS:

            for (int y = 0; y < img.numYLevels (); ++y)
                for (int x = 0; x < img.numXLevels (); ++x)
                    loadLevel (in, img, x, y);

            break;

        default: assert (false);
    }

    for (Header::ConstIterator i = in.header ().begin ();
         i != in.header ().end ();
         ++i)
    {
        hdr.insert (i.name (), i.attribute ());
    }
}